

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::
     UnaryUpdate<duckdb::QuantileState<double,duckdb::QuantileStandardType>,double,duckdb::MedianAbsoluteDeviationOperation<double>>
               (Vector *input,AggregateInputData *aggr_input_data,data_ptr_t state,idx_t count)

{
  long lVar1;
  FunctionData *pFVar2;
  iterator iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  AggregateUnaryInput input_data;
  unsigned_long *local_90;
  ulong local_88;
  Vector *local_80;
  AggregateUnaryInput local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  if (*input == (Vector)0x0) {
    lVar1 = *(long *)(input + 0x20);
    FlatVector::VerifyFlatVector(input);
    if (0x3f < count + 0x3f) {
      local_88 = count + 0x3f >> 6;
      uVar5 = 0;
      uVar6 = 0;
      local_80 = input;
      do {
        if (*(long *)(input + 0x28) == 0) {
          uVar4 = 0xffffffffffffffff;
        }
        else {
          uVar4 = *(ulong *)(*(long *)(input + 0x28) + uVar5 * 8);
        }
        uVar7 = uVar6 + 0x40;
        if (count <= uVar6 + 0x40) {
          uVar7 = count;
        }
        uVar8 = uVar7;
        if (uVar4 != 0) {
          uVar8 = uVar6;
          if (uVar4 == 0xffffffffffffffff) {
            if (uVar6 < uVar7) {
              do {
                local_78.input = *(AggregateInputData **)(lVar1 + uVar6 * 8);
                iVar3._M_current = *(double **)(state + 8);
                if (iVar3._M_current == *(double **)(state + 0x10)) {
                  std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                            ((vector<double,_std::allocator<double>_> *)state,iVar3,
                             (double *)&local_78);
                }
                else {
                  *iVar3._M_current = (double)local_78.input;
                  *(double **)(state + 8) = iVar3._M_current + 1;
                }
                uVar6 = uVar6 + 1;
                uVar8 = uVar6;
              } while (uVar7 != uVar6);
            }
          }
          else if (uVar6 < uVar7) {
            uVar8 = 0;
            do {
              if ((uVar4 >> (uVar8 & 0x3f) & 1) != 0) {
                local_78.input = *(AggregateInputData **)(lVar1 + uVar6 * 8 + uVar8 * 8);
                iVar3._M_current = *(double **)(state + 8);
                if (iVar3._M_current == *(double **)(state + 0x10)) {
                  std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                            ((vector<double,_std::allocator<double>_> *)state,iVar3,
                             (double *)&local_78);
                }
                else {
                  *iVar3._M_current = (double)local_78.input;
                  *(double **)(state + 8) = iVar3._M_current + 1;
                }
              }
              uVar8 = uVar8 + 1;
            } while ((uVar6 - uVar7) + uVar8 != 0);
            input = local_80;
            uVar8 = uVar6 + uVar8;
          }
        }
        uVar5 = uVar5 + 1;
        uVar6 = uVar8;
      } while (uVar5 != local_88);
    }
  }
  else if (*input == (Vector)0x2) {
    if ((*(byte **)(input + 0x28) == (byte *)0x0) || ((**(byte **)(input + 0x28) & 1) != 0)) {
      local_78.input_mask = (ValidityMask *)(input + 0x28);
      local_78.input_idx = 0;
      local_78.input = aggr_input_data;
      QuantileOperation::
      ConstantOperation<double,duckdb::QuantileState<double,duckdb::QuantileStandardType>,duckdb::MedianAbsoluteDeviationOperation<double>>
                ((QuantileState<double,_duckdb::QuantileStandardType> *)state,
                 *(double **)(input + 0x20),&local_78,count);
    }
  }
  else {
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_78);
    duckdb::Vector::ToUnifiedFormat((ulong)input,(UnifiedVectorFormat *)count);
    if (local_78.input_idx == 0) {
      if (count != 0) {
        pFVar2 = ((local_78.input)->bind_data).ptr;
        uVar6 = 0;
        do {
          uVar5 = uVar6;
          if (pFVar2 != (FunctionData *)0x0) {
            uVar5 = (ulong)*(uint *)(pFVar2 + uVar6 * 4);
          }
          local_90 = (&((local_78.input_mask)->super_TemplatedValidityMask<unsigned_long>).
                       validity_mask)[uVar5];
          iVar3._M_current = *(double **)(state + 8);
          if (iVar3._M_current == *(double **)(state + 0x10)) {
            std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                      ((vector<double,_std::allocator<double>_> *)state,iVar3,(double *)&local_90);
          }
          else {
            *iVar3._M_current = (double)local_90;
            *(double **)(state + 8) = iVar3._M_current + 1;
          }
          uVar6 = uVar6 + 1;
        } while (count != uVar6);
      }
    }
    else if (count != 0) {
      pFVar2 = ((local_78.input)->bind_data).ptr;
      uVar6 = 0;
      do {
        uVar5 = uVar6;
        if (pFVar2 != (FunctionData *)0x0) {
          uVar5 = (ulong)*(uint *)(pFVar2 + uVar6 * 4);
        }
        if ((local_78.input_idx == 0) ||
           ((*(ulong *)(local_78.input_idx + (uVar5 >> 6) * 8) >> (uVar5 & 0x3f) & 1) != 0)) {
          local_90 = (&((local_78.input_mask)->super_TemplatedValidityMask<unsigned_long>).
                       validity_mask)[uVar5];
          iVar3._M_current = *(double **)(state + 8);
          if (iVar3._M_current == *(double **)(state + 0x10)) {
            std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                      ((vector<double,_std::allocator<double>_> *)state,iVar3,(double *)&local_90);
          }
          else {
            *iVar3._M_current = (double)local_90;
            *(double **)(state + 8) = iVar3._M_current + 1;
          }
        }
        uVar6 = uVar6 + 1;
      } while (count != uVar6);
    }
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    }
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
    }
  }
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}